

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_putbit.c
# Opt level: O0

MPP_RET vp8e_put_bool(Vp8ePutBitBuf *bitbuf,RK_S32 prob,RK_S32 bool_value)

{
  int iVar1;
  RK_U8 *pRVar2;
  RK_U8 *local_28;
  RK_U8 *data;
  RK_S32 split;
  RK_S32 bool_value_local;
  RK_S32 prob_local;
  Vp8ePutBitBuf *bitbuf_local;
  
  iVar1 = ((bitbuf->range + -1) * prob >> 8) + 1;
  if (bool_value == 0) {
    bitbuf->range = iVar1;
  }
  else {
    bitbuf->bottom = iVar1 + bitbuf->bottom;
    bitbuf->range = bitbuf->range - iVar1;
  }
  while (bitbuf->range < 0x80) {
    if (bitbuf->bottom < 0) {
      local_28 = bitbuf->data;
      while (pRVar2 = local_28 + -1, local_28[-1] == 0xff) {
        *pRVar2 = '\0';
        local_28 = pRVar2;
      }
      *pRVar2 = *pRVar2 + '\x01';
    }
    bitbuf->range = bitbuf->range << 1;
    bitbuf->bottom = bitbuf->bottom << 1;
    iVar1 = bitbuf->bits_left + -1;
    bitbuf->bits_left = iVar1;
    if (iVar1 == 0) {
      pRVar2 = bitbuf->data;
      bitbuf->data = pRVar2 + 1;
      *pRVar2 = (RK_U8)((uint)bitbuf->bottom >> 0x18);
      bitbuf->byte_cnt = bitbuf->byte_cnt + 1;
      bitbuf->bottom = bitbuf->bottom & 0xffffff;
      bitbuf->bits_left = 8;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp8e_put_bool(Vp8ePutBitBuf *bitbuf, RK_S32 prob, RK_S32 bool_value)
{
    RK_S32 split = 1 + ((bitbuf->range - 1) * prob >> 8);

    if (bool_value) {
        bitbuf->bottom += split;
        bitbuf->range -= split;
    } else {
        bitbuf->range = split;
    }

    while (bitbuf->range < 128) {
        if (bitbuf->bottom < 0) {
            RK_U8 *data = bitbuf->data;
            while (*--data == 255) {
                *data = 0;
            }
            (*data)++;
        }
        bitbuf->range <<= 1;
        bitbuf->bottom <<= 1;

        if (!--bitbuf->bits_left) {
            *bitbuf->data++ = (bitbuf->bottom >> 24) & 0xff;
            bitbuf->byte_cnt++;
            bitbuf->bottom &= 0xffffff;     /* Keep 3 bytes */
            bitbuf->bits_left = 8;
        }
    }
    return MPP_OK;
}